

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::pid_formatter<spdlog::details::scoped_padder>::format
          (pid_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  scoped_padder p;
  char *in_stack_ffffffffffffff98;
  padding_info *in_stack_ffffffffffffffa0;
  format_int local_38;
  
  uVar1 = getpid();
  uVar2 = 0x1f;
  if ((uVar1 | 1) != 0) {
    for (; (uVar1 | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar2 = (uVar2 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  scoped_padder::scoped_padder
            ((scoped_padder *)&stack0xffffffffffffffa0,
             (ulong)((uVar2 + 1) -
                    (uint)(uVar1 < *(uint *)(fmt::v6::internal::basic_data<void>::
                                             zero_or_powers_of_10_32 + (ulong)uVar2 * 4))),
             &(this->super_flag_formatter).padinfo_,dest);
  local_38.str_ = fmt::v6::format_int::format_decimal(&local_38,(ulong)uVar1);
  lVar3 = (long)&local_38 - (long)local_38.str_;
  if (-0x16 < lVar3) {
    fmt::v6::internal::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_38.str_,local_38.str_ + lVar3 + 0x15);
    scoped_padder::~scoped_padder((scoped_padder *)&stack0xffffffffffffffa0);
    return;
  }
  fmt::v6::internal::assert_fail((char *)in_stack_ffffffffffffffa0,0,in_stack_ffffffffffffff98);
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = ScopedPadder::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }